

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

void __thiscall Renderer::Render(Renderer *this,Snake *snake,SDL_Point *food)

{
  pointer pSVar1;
  undefined8 uVar2;
  char *pcVar3;
  SDL_Point *point;
  pointer pSVar4;
  SDL_Renderer *pSVar5;
  SDL_Rect block;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  local_30 = (int)(this->screen_width / this->grid_width);
  local_2c = (int)(this->screen_height / this->grid_height);
  SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0xff,0xff,0xff);
  SDL_RenderClear(this->sdl_renderer);
  local_38 = local_30 * food->x;
  local_34 = local_2c * food->y;
  if (Game::food_counter == 0 || (Game::food_counter & 3U) != 0) {
    pcVar3 = "../resources/elikoptero.bmp";
    if (0x1c71c71c < Game::food_counter * 0x38e38e39 + 0xe38e38eU) {
      pcVar3 = "../resources/cash.bmp";
    }
    if (Game::food_counter == 0) {
      pcVar3 = "../resources/cash.bmp";
    }
  }
  else {
    pcVar3 = "../resources/kotero.bmp";
  }
  pSVar5 = this->sdl_renderer;
  uVar2 = SDL_RWFromFile(pcVar3,"rb");
  uVar2 = SDL_LoadBMP_RW(uVar2,1);
  uVar2 = SDL_CreateTextureFromSurface(pSVar5,uVar2);
  SDL_RenderCopy(pSVar5,uVar2,0,&local_38);
  SDL_SetRenderDrawColor(this->sdl_renderer,0xea,0xaa,0,0xff);
  pSVar1 = (snake->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar4 = (snake->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
    local_38 = local_30 * pSVar4->x;
    local_34 = local_2c * pSVar4->y;
    SDL_RenderFillRect(this->sdl_renderer,&local_38);
  }
  local_38 = (int)snake->head_x * local_30;
  local_34 = (int)snake->head_y * local_2c;
  if (snake->alive == false) {
    SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0,0,0xff);
    SDL_RenderFillRect(this->sdl_renderer,&local_38);
  }
  else {
    switch(snake->direction) {
    case kUp:
      pSVar5 = this->sdl_renderer;
      pcVar3 = "../resources/madclip-top.bmp";
      break;
    case kDown:
      pSVar5 = this->sdl_renderer;
      pcVar3 = "../resources/madclip-down.bmp";
      break;
    case kLeft:
      pSVar5 = this->sdl_renderer;
      pcVar3 = "../resources/madclip-left.bmp";
      break;
    case kRight:
      pSVar5 = this->sdl_renderer;
      pcVar3 = "../resources/madclip-right.bmp";
      break;
    default:
      goto switchD_00103f68_default;
    }
    uVar2 = SDL_RWFromFile(pcVar3,"rb");
    uVar2 = SDL_LoadBMP_RW(uVar2,1);
    uVar2 = SDL_CreateTextureFromSurface(pSVar5,uVar2);
    SDL_RenderCopy(pSVar5,uVar2,0,&local_38);
  }
switchD_00103f68_default:
  SDL_RenderPresent(this->sdl_renderer);
  return;
}

Assistant:

void Renderer::Render(Snake const snake, SDL_Point const &food) {
  SDL_Rect block;
  double degrees;
  block.w = screen_width / (grid_width);
  block.h = screen_height / (grid_height);

  // Clear screen
  SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0xFF, 0xFF, 0xFF);
  SDL_RenderClear(sdl_renderer);

  // Render food
  block.x = food.x * block.w;
  block.y = food.y * block.h;


  //rendering special food
  if(Game::food_counter !=0 && Game::food_counter%4 == 0){
    SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/kotero.bmp")), NULL, &block);
  }
  else if (Game::food_counter !=0 && Game::food_counter%9 == 0)
  {
    SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/elikoptero.bmp")), NULL, &block);
  }
  else
  {
    SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/cash.bmp")), NULL, &block);
  } 

  // Render snake's body
  SDL_SetRenderDrawColor(sdl_renderer, 234, 170, 0, 255);
  for (SDL_Point const &point : snake.body) {
    block.x = point.x * block.w;
    block.y = point.y * block.h;
    SDL_RenderFillRect(sdl_renderer, &block);
  }

  // Render snake's head
  block.x = static_cast<int>(snake.head_x) * block.w;
  block.y = static_cast<int>(snake.head_y) * block.h;

  if (snake.alive) {

      
    switch (snake.direction) 
    {
      case Snake::Direction::kUp:
        SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/madclip-top.bmp")), NULL, &block);
        break;
      case Snake::Direction::kRight:
        SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/madclip-right.bmp")), NULL, &block);
        break;
      case Snake::Direction::kDown:
        SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/madclip-down.bmp")), NULL, &block);
        break;
      case Snake::Direction::kLeft:
        SDL_RenderCopy(sdl_renderer,SDL_CreateTextureFromSurface(sdl_renderer, SDL_LoadBMP("../resources/madclip-left.bmp")), NULL, &block);
        break;
    }
    
  } else {
    SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0x00, 0x00, 0xFF);
    SDL_RenderFillRect(sdl_renderer, &block);
  }


  // Update Screen
  SDL_RenderPresent(sdl_renderer);
}